

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O3

int __thiscall cppcms::http::context::on_headers_ready(context *this)

{
  _data *p_Var1;
  application *paVar2;
  element_type *peVar3;
  _data *p_Var4;
  intrusive_ptr<cppcms::application> this_00;
  intrusive_ptr<cppcms::application> iVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  application *tmp;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  service *psVar11;
  applications_pool *host;
  unsigned_long_long uVar12;
  intrusive_ptr<cppcms::application> app;
  string matched;
  intrusive_ptr<cppcms::application> local_90;
  applications_pool local_88;
  undefined1 local_78 [40];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  intrusive_ptr<cppcms::application> local_30;
  
  iVar7 = (*((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0x17])();
  iVar8 = (*((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0x16])();
  iVar9 = (*((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0x15])();
  local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78[0x18] = 0;
  local_90.p_ = (application *)0x0;
  local_78._8_8_ = (element_type *)(local_78 + 0x18);
  psVar11 = cppcms::impl::cgi::connection::service
                      ((this->conn_).
                       super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  host = cppcms::service::applications_pool(psVar11);
  applications_pool::get_application_specific_pool
            (&local_88,(char *)host,(char *)CONCAT44(extraout_var,iVar7),
             (char *)CONCAT44(extraout_var_01,iVar9),(string *)CONCAT44(extraout_var_00,iVar8));
  if ((element_type *)local_88.srv_ == (element_type *)0x0) {
    iVar7 = 0x194;
  }
  else {
    http::request::prepare(&((this->d).ptr_)->request);
    uVar12 = http::request::content_length(&((this->d).ptr_)->request);
    if (uVar12 != 0) {
      uVar10 = application_specific_pool::flags((application_specific_pool *)local_88.srv_);
      psVar11 = local_88.srv_;
      if ((uVar10 & 0x40) != 0 && (uVar10 & 0xf) != 0) {
        cppcms::impl::cgi::connection::service
                  ((this->conn_).
                   super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        application_specific_pool::get((application_specific_pool *)local_78,psVar11);
        uVar6 = local_78._0_8_;
        local_78._0_8_ = (application *)0x0;
        local_30.p_ = local_90.p_;
        local_90.p_ = (application *)uVar6;
        booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_30);
        booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                  ((intrusive_ptr<cppcms::application> *)local_78);
        this_00.p_ = local_90.p_;
        if (local_90.p_ == (application *)0x0) {
          iVar7 = 500;
          goto LAB_001d263f;
        }
        application::add_context(local_90.p_,this);
        iVar5.p_ = local_90.p_;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,local_78._8_8_,
                   (undefined1 *)
                   ((long)(_func_int ***)local_78._8_8_ + (long)(_func_int ***)local_78._16_8_));
        (*(iVar5.p_)->_vptr_application[2])(iVar5.p_,local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        anon_unknown_3::context_guard::~context_guard((context_guard *)this_00.p_);
      }
    }
    p_Var1 = (this->d).ptr_;
    peVar3 = (p_Var1->pool).
             super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (_data *)(p_Var1->pool).
                      super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
    (p_Var1->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_88.srv_;
    (p_Var1->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.d.ptr_;
    local_88.srv_ = (service *)peVar3;
    local_88.d.ptr_ = p_Var4;
    std::__cxx11::string::swap((string *)&((this->d).ptr_)->matched);
    p_Var1 = (this->d).ptr_;
    paVar2 = (p_Var1->app).p_;
    (p_Var1->app).p_ = local_90.p_;
    local_90.p_ = paVar2;
    iVar7 = http::request::on_content_start(&p_Var1->request);
  }
LAB_001d263f:
  if (local_88.d.ptr_ != (_data *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.d.ptr_);
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_90);
  if ((element_type *)local_78._8_8_ != (element_type *)(local_78 + 0x18)) {
    operator_delete((void *)local_78._8_8_);
  }
  return iVar7;
}

Assistant:

int context::on_headers_ready()
{
	char const *host = conn_->env_http_host();
	char const *path_info = conn_->env_path_info();
	char const *script_name = conn_->env_script_name();
	std::string matched;

	booster::intrusive_ptr<application> app;
	booster::shared_ptr<application_specific_pool> pool = 
		service().applications_pool().get_application_specific_pool(
			host,
			script_name,
			path_info,
			matched
			);
	if(!pool)
		return 404;
	
	request().prepare();

	int flags;
	
	if(request().content_length() != 0 && ((flags=pool->flags()) & app::op_mode_mask) != app::synchronous && (flags & app::content_filter)!=0) {
		app = pool->get(service());
		if(!app)
			return 500;
		try {
			context_guard g(app.get(),*this);
			app->main(matched);
		}
		catch(...) {
			return translate_exception();
		}
	}

	d->pool.swap(pool);
	d->matched.swap(matched);
	d->app.swap(app);
	
	return request().on_content_start();
}